

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O1

void __thiscall glslang::TQualifier::clear(TQualifier *this)

{
  this->semanticName = (char *)0x0;
  *(ulong *)&this->field_0x8 = *(ulong *)&this->field_0x8 & 0xf800001401ff0000;
  clearLayout(this);
  this->spirvStorageClass = -1;
  this->spirvDecorate = (TSpirvDecorate *)0x0;
  *(ulong *)&this->field_0x8 = *(ulong *)&this->field_0x8 & 0xe3ffffe7fe00ffff;
  return;
}

Assistant:

void clear()
    {
        precision = EpqNone;
        invariant = false;
        makeTemporary();
        declaredBuiltIn = EbvNone;
        noContraction = false;
        nullInit = false;
        spirvByReference = false;
        spirvLiteral = false;
        defaultBlock = false;
    }